

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall DLevelScript::SetActorProperty(DLevelScript *this,int tid,int property,int value)

{
  AActor *pAVar1;
  
  if (tid != 0) {
    for (pAVar1 = AActor::TIDHash[tid & 0x7f]; pAVar1 != (AActor *)0x0; pAVar1 = pAVar1->inext) {
      if (pAVar1->tid == tid) {
        DoSetActorProperty(this,pAVar1,property,value);
      }
    }
    return;
  }
  pAVar1 = (this->activator).field_0.p;
  if (pAVar1 != (AActor *)0x0) {
    if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0050e1d0;
    (this->activator).field_0.p = (AActor *)0x0;
  }
  pAVar1 = (AActor *)0x0;
LAB_0050e1d0:
  DoSetActorProperty(this,pAVar1,property,value);
  return;
}

Assistant:

void DLevelScript::SetActorProperty (int tid, int property, int value)
{
	if (tid == 0)
	{
		DoSetActorProperty (activator, property, value);
	}
	else
	{
		AActor *actor;
		FActorIterator iterator (tid);

		while ((actor = iterator.Next()) != NULL)
		{
			DoSetActorProperty (actor, property, value);
		}
	}
}